

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

FState * __thiscall FStateDefinitions::FindState(FStateDefinitions *this,char *name)

{
  ulong uVar1;
  FState *pFVar2;
  FStateDefine *pFVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  MakeStateNameList(name);
  uVar1 = (ulong)MakeStateNameList::namelist.Count;
  bVar6 = uVar1 != 0;
  if (uVar1 == 0) {
LAB_004566fd:
    pFVar3 = (FStateDefine *)0x0;
  }
  else {
    uVar4 = 0;
    do {
      uVar5 = (ulong)(this->StateLabels).Count;
      if (uVar5 != 0) {
        pFVar3 = (this->StateLabels).Array;
        do {
          if ((pFVar3->Label).Index == MakeStateNameList::namelist.Array[uVar4].Index)
          goto LAB_004566e7;
          pFVar3 = pFVar3 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      pFVar3 = (FStateDefine *)0x0;
LAB_004566e7:
      if (pFVar3 == (FStateDefine *)0x0) goto LAB_004566fd;
      this = (FStateDefinitions *)&pFVar3->Children;
      uVar4 = uVar4 + 1;
      bVar6 = uVar4 < uVar1;
    } while (uVar4 != uVar1);
  }
  pFVar2 = (FState *)0x0;
  if ((!bVar6) && (pFVar3 != (FStateDefine *)0x0)) {
    pFVar2 = pFVar3->State;
  }
  return pFVar2;
}

Assistant:

FState *FStateDefinitions::FindState(const char * name)
{
	FStateDefine *statedef = NULL;

	TArray<FName> &namelist = MakeStateNameList(name);

	TArray<FStateDefine> *statelist = &StateLabels;
	for(unsigned i = 0; i < namelist.Size(); i++)
	{
		statedef = FindStateLabelInList(*statelist, namelist[i], false);
		if (statedef == NULL)
		{
			return NULL;
		}
		statelist = &statedef->Children;
	}
	return statedef ? statedef->State : NULL;
}